

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsDQJtimes(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *cvode_mem,
                N_Vector work)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  
  iVar2 = cvLs_AccessLMem(cvode_mem,"cvLsDQJtimes",&cv_mem,&cvls_mem);
  if (iVar2 == 0) {
    dVar5 = (double)N_VWrmsNorm(v,cv_mem->cv_ewt);
    dVar5 = 1.0 / dVar5;
    bVar1 = true;
    iVar2 = 3;
    while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
      N_VLinearSum(dVar5,0x3ff0000000000000,v,y,work);
      iVar3 = (*cvls_mem->jt_f)(t,work,Jv,cv_mem->cv_user_data);
      cvls_mem->nfeDQ = cvls_mem->nfeDQ + 1;
      if (iVar3 == 0) goto LAB_001252ec;
      if (iVar3 < 0) {
        return -1;
      }
      dVar5 = dVar5 * 0.25;
      bVar1 = false;
    }
    if (bVar1) {
LAB_001252ec:
      N_VLinearSum(1.0 / dVar5,-(1.0 / dVar5),Jv,fy,Jv);
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int cvLsDQJtimes(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y,
                 N_Vector fy, void* cvode_mem, N_Vector work)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  sunrealtype sig, siginv;
  int iter, retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Initialize perturbation to 1/||v|| */
  sig = ONE / N_VWrmsNorm(v, cv_mem->cv_ewt);

  for (iter = 0; iter < MAX_DQITERS; iter++)
  {
    /* Set work = y + sig*v */
    N_VLinearSum(sig, v, ONE, y, work);

    /* Set Jv = f(tn, y+sig*v) */
    retval = cvls_mem->jt_f(t, work, Jv, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval == 0) { break; }
    if (retval < 0) { return (-1); }

    /* If f failed recoverably, shrink sig and retry */
    sig *= PT25;
  }

  /* If retval still isn't 0, return with a recoverable failure */
  if (retval > 0) { return (+1); }

  /* Replace Jv by (Jv - fy)/sig */
  siginv = ONE / sig;
  N_VLinearSum(siginv, Jv, -siginv, fy, Jv);

  return (0);
}